

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  string *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  Metadata MVar4;
  long *local_40 [2];
  long local_30 [2];
  LogMessageFatal local_20 [16];
  
  MVar4 = Message::GetMetadata(m);
  if (MVar4.reflection != (Reflection *)0x0) {
    return MVar4.reflection;
  }
  MVar4 = Message::GetMetadata(m);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/reflection_ops.cc"
             ,0x25);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_20,0x2a,"Message does not support reflection (type ");
  if (MVar4.descriptor == (Descriptor *)0x0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"unknown","");
  }
  else {
    psVar1 = (MVar4.descriptor)->all_names_;
    local_40[0] = local_30;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + psVar1->_M_string_length);
  }
  uVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                    ((LogMessage *)local_20,(string *)local_40);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(uVar3,2,").");
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    // RawMessage is one known type for which GetReflection() returns nullptr.
    ABSL_LOG(FATAL) << "Message does not support reflection (type "
                    << (d ? d->name() : "unknown") << ").";
  }
  return r;
}